

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

SQInteger __thiscall
SQClass::Next(SQClass *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQClassMember *pSVar4;
  uint uVar5;
  SQObjectType SVar6;
  SQInteger SVar7;
  ulong uVar8;
  SQObjectType *pSVar9;
  SQObjectType *pSVar10;
  SQObjectPtr oval;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  SVar7 = SQTable::Next(this->_members,false,refpos,outkey,&local_28);
  if (SVar7 != -1) {
    uVar5 = local_28.super_SQObject._unVal._0_4_ & 0xffffff;
    if ((local_28.super_SQObject._unVal._0_4_ >> 0x18 & 1) == 0) {
      pSVar9 = (SQObjectType *)
               ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type +
               (ulong)(uVar5 << 5));
      pSVar10 = pSVar9 + 2;
      SVar6 = *pSVar9;
      if (SVar6 == OT_WEAKREF) {
        SVar6 = *(SQObjectType *)(*(undefined8 *)pSVar10 + 0x18);
        pSVar10 = (SQObjectType *)(*(undefined8 *)pSVar10 + 0x20);
      }
      SVar2 = (outval->super_SQObject)._type;
      pSVar3 = (outval->super_SQObject)._unVal.pTable;
      (outval->super_SQObject)._unVal.pWeakRef = *(SQWeakRef **)pSVar10;
      (outval->super_SQObject)._type = SVar6;
      if ((SVar6 >> 0x1b & 1) != 0) {
        pSVar1 = &(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
    else {
      pSVar4 = (this->_methods)._vals;
      uVar8 = (ulong)(uVar5 << 5);
      SVar6 = (outval->super_SQObject)._type;
      pSVar3 = (outval->super_SQObject)._unVal.pTable;
      (outval->super_SQObject)._unVal =
           *(SQObjectValue *)((long)&(pSVar4->val).super_SQObject._unVal + uVar8);
      SVar2 = *(SQObjectType *)((long)&(pSVar4->val).super_SQObject._type + uVar8);
      (outval->super_SQObject)._type = SVar2;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar6 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar7;
}

Assistant:

SQInteger SQClass::Next(const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQObjectPtr oval;
    SQInteger idx = _members->Next(false,refpos,outkey,oval);
    if(idx != -1) {
        if(_ismethod(oval)) {
            outval = _methods[_member_idx(oval)].val;
        }
        else {
            SQObjectPtr &o = _defaultvalues[_member_idx(oval)].val;
            outval = _realval(o);
        }
    }
    return idx;
}